

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolor.cpp
# Opt level: O1

void __thiscall QColor::setRgb(QColor *this,QRgb rgb)

{
  this->cspec = Rgb;
  (this->ct).argb.alpha = 0xffff;
  (this->ct).argb.red = (ushort)((rgb >> 0x10) << 8) | (ushort)((rgb & 0xffff00) >> 0x10);
  (this->ct).argb.green = (ushort)(rgb & 0xffff00) | (ushort)(rgb >> 8) & 0xff;
  (this->ct).argb.blue = (ushort)(rgb << 8) | (ushort)rgb & 0xff;
  (this->ct).argb.pad = 0;
  return;
}

Assistant:

void QColor::setRgb(QRgb rgb) noexcept
{
    cspec = Rgb;
    ct.argb.alpha = 0xffff;
    ct.argb.red   = qRed(rgb)   * 0x101;
    ct.argb.green = qGreen(rgb) * 0x101;
    ct.argb.blue  = qBlue(rgb)  * 0x101;
    ct.argb.pad   = 0;
}